

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O1

int write_sparse_fill_chunk(output_file *out,uint len,uint32_t fill_val)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  chunk_header_t chunk_header;
  uint32_t local_30 [2];
  uint local_28;
  undefined4 local_24;
  
  uVar1 = out->block_size;
  uVar4 = (len + uVar1) - 1;
  local_28 = uVar4 / uVar1;
  local_30[1] = 0xcac2;
  local_24 = 0x10;
  local_30[0] = fill_val;
  iVar2 = (*out->ops->write)(out,local_30 + 1,0xc);
  iVar6 = -1;
  if (-1 < iVar2) {
    iVar2 = (*out->ops->write)(out,local_30,4);
    if (-1 < iVar2) {
      if ((out->use_crc != 0) && (3 < out->block_size)) {
        uVar5 = out->block_size >> 2;
        do {
          uVar3 = sparse_crc32(out->crc32,local_30,4);
          out->crc32 = uVar3;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      out->cur_out_ptr = out->cur_out_ptr + (long)(int)(uVar4 - uVar4 % uVar1);
      out->chunk_cnt = out->chunk_cnt + 1;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int write_sparse_fill_chunk(struct output_file* out, unsigned int len, uint32_t fill_val) {
  chunk_header_t chunk_header;
  int rnd_up_len, count;
  int ret;

  /* Round up the fill length to a multiple of the block size */
  rnd_up_len = ALIGN(len, out->block_size);

  /* Finally we can safely emit a chunk of data */
  chunk_header.chunk_type = CHUNK_TYPE_FILL;
  chunk_header.reserved1 = 0;
  chunk_header.chunk_sz = rnd_up_len / out->block_size;
  chunk_header.total_sz = CHUNK_HEADER_LEN + sizeof(fill_val);
  ret = out->ops->write(out, &chunk_header, sizeof(chunk_header));

  if (ret < 0) return -1;
  ret = out->ops->write(out, &fill_val, sizeof(fill_val));
  if (ret < 0) return -1;

  if (out->use_crc) {
    count = out->block_size / sizeof(uint32_t);
    while (count--) out->crc32 = sparse_crc32(out->crc32, &fill_val, sizeof(uint32_t));
  }

  out->cur_out_ptr += rnd_up_len;
  out->chunk_cnt++;

  return 0;
}